

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemStringify(Mem *pMem,u8 enc,u8 bForce)

{
  char cVar1;
  ushort uVar2;
  undefined2 uVar3;
  int iVar4;
  uint uVar5;
  char *z2;
  char *pcVar6;
  
  uVar2 = pMem->flags;
  if (pMem->szMalloc < 0x20) {
    iVar4 = sqlite3VdbeMemGrow(pMem,0x20,0);
    if (iVar4 != 0) {
      return 7;
    }
  }
  else {
    pMem->z = pMem->zMalloc;
    pMem->flags = uVar2 & 0xd;
  }
  if ((uVar2 & 4) == 0) {
    sqlite3_snprintf(0x20,pMem->z,"%!.15g",(pMem->u).r);
  }
  else {
    sqlite3_snprintf(0x20,pMem->z,"%lld",(pMem->u).r);
  }
  pcVar6 = pMem->z;
  uVar5 = 0;
  if (pcVar6 != (char *)0x0) {
    uVar5 = 0xffffffff;
    do {
      uVar5 = uVar5 + 1;
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar1 != '\0');
    uVar5 = uVar5 & 0x3fffffff;
  }
  pMem->n = uVar5;
  pMem->enc = '\x01';
  uVar3 = pMem->flags;
  uVar2 = uVar3 & 0xfff3;
  if (bForce == '\0') {
    uVar2 = uVar3;
  }
  pMem->flags = uVar2 | 0x202;
  if (enc != '\x01') {
    sqlite3VdbeMemTranslate(pMem,enc);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemStringify(Mem *pMem, u8 enc, u8 bForce){
  int fg = pMem->flags;
  const int nByte = 32;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( !(fg&MEM_Zero) );
  assert( !(fg&(MEM_Str|MEM_Blob)) );
  assert( fg&(MEM_Int|MEM_Real) );
  assert( (pMem->flags&MEM_RowSet)==0 );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );


  if( sqlite3VdbeMemClearAndResize(pMem, nByte) ){
    return SQLITE_NOMEM;
  }

  /* For a Real or Integer, use sqlite3_snprintf() to produce the UTF-8
  ** string representation of the value. Then, if the required encoding
  ** is UTF-16le or UTF-16be do a translation.
  ** 
  ** FIX ME: It would be better if sqlite3_snprintf() could do UTF-16.
  */
  if( fg & MEM_Int ){
    sqlite3_snprintf(nByte, pMem->z, "%lld", pMem->u.i);
  }else{
    assert( fg & MEM_Real );
    sqlite3_snprintf(nByte, pMem->z, "%!.15g", pMem->u.r);
  }
  pMem->n = sqlite3Strlen30(pMem->z);
  pMem->enc = SQLITE_UTF8;
  pMem->flags |= MEM_Str|MEM_Term;
  if( bForce ) pMem->flags &= ~(MEM_Int|MEM_Real);
  sqlite3VdbeChangeEncoding(pMem, enc);
  return SQLITE_OK;
}